

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionStateTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionStateTests::TestClearSessionLog_StateLogNotNull_LogCleared::
TestClearSessionLog_StateLogNotNull_LogCleared(TestClearSessionLog_StateLogNotNull_LogCleared *this)

{
  char *suiteName;
  TestClearSessionLog_StateLogNotNull_LogCleared *this_local;
  
  suiteName = SuiteSessionStateTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"ClearSessionLog_StateLogNotNull_LogCleared",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionStateTestCase.cpp"
             ,0x37);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestClearSessionLog_StateLogNotNull_LogCleared_00459cb0;
  return;
}

Assistant:

TEST(ClearSessionLog_StateLogNotNull_LogCleared)
  {
    SessionSettings settings;
    TestLog log;
    log.events = 5;

    SessionState state;
    state.log(&log);

    state.clear();

    CHECK_EQUAL(0, log.events);
  }